

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O2

CordRepBtree *
absl::lts_20250127::cord_internal::CordRepBtree::
NewLeaf<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>(string_view data,size_t extra)

{
  CordRepBtree *pCVar1;
  CordRepFlat *this;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  size_t in_R8;
  char *dst;
  string_view s;
  
  pcVar4 = (char *)0x0;
  pCVar1 = New(0);
  (pCVar1->super_CordRep).storage[2] = '\x06';
  lVar3 = 6;
  while( true ) {
    dst = (char *)data._M_len;
    if ((dst == (char *)0x0) || (lVar3 == 0)) break;
    this = CordRepFlat::NewImpl<4096ul>((size_t)(dst + extra));
    pcVar2 = (char *)CordRepFlat::Capacity(this);
    if (dst <= pcVar2) {
      pcVar2 = dst;
    }
    (this->super_CordRep).length = (size_t)pcVar2;
    pcVar4 = pcVar4 + (long)pcVar2;
    *(CordRepFlat **)((pCVar1->super_CordRep).storage + lVar3 * 8 + -5) = this;
    s._M_str = pcVar2;
    s._M_len = (size_t)data._M_str;
    data = anon_unknown_0::Consume<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                     ((anon_unknown_0 *)(this->super_CordRep).storage,dst,s,in_R8);
    lVar3 = lVar3 + -1;
  }
  (pCVar1->super_CordRep).length = (size_t)pcVar4;
  (pCVar1->super_CordRep).storage[1] = (uint8_t)lVar3;
  return pCVar1;
}

Assistant:

CordRepBtree* CordRepBtree::NewLeaf<kFront>(absl::string_view data,
                                            size_t extra) {
  CordRepBtree* leaf = CordRepBtree::New(0);
  size_t length = 0;
  size_t begin = leaf->capacity();
  leaf->set_end(leaf->capacity());
  while (!data.empty() && begin != 0) {
    auto* flat = CordRepFlat::New(data.length() + extra);
    flat->length = (std::min)(data.length(), flat->Capacity());
    length += flat->length;
    leaf->edges_[--begin] = flat;
    data = Consume<kFront>(flat->Data(), data, flat->length);
  }
  leaf->length = length;
  leaf->set_begin(begin);
  return leaf;
}